

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_string.cc
# Opt level: O0

void SplitStringToSetUsing
               (string *full,char *delim,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  ostream *poVar1;
  ostream *poVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  simple_insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  Logger *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  int line;
  string *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  LogSeverity severity;
  simple_insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [16];
  simple_insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  long local_10;
  
  severity = (LogSeverity)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  line = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  if (in_RSI == 0) {
    local_10 = in_RSI;
    Logger::Logger(&local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"SplitStringToSetUsing",(allocator *)&stack0xffffffffffffff87);
    poVar1 = Logger::Start(severity,in_stack_ffffffffffffff08,line,in_stack_fffffffffffffef8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3e);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"delim != NULL");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10 != 0);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger(in_stack_fffffffffffffe90);
    abort();
  }
  if (in_RDX == (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    local_18 = in_RDX;
    Logger::Logger((Logger *)&stack0xffffffffffffff80,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
               ,&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"SplitStringToSetUsing",&local_c9);
    poVar1 = Logger::Start(severity,in_stack_ffffffffffffff08,line,in_stack_fffffffffffffef8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3f);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar2 = std::operator<<(poVar1,"result != NULL");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,local_18 !=
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  simple_insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::simple_insert_iterator(&local_d8,in_RDX);
  SplitStringToIteratorUsing<std::__cxx11::string,simple_insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  return;
}

Assistant:

void SplitStringToSetUsing(const std::string& full,
                           const char* delim,
                           std::set<std::string>* result) {
  CHECK(delim != NULL);
  CHECK(result != NULL);
  simple_insert_iterator<std::set<std::string> > it(result);
  SplitStringToIteratorUsing(full, delim, it);
}